

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O1

BOOL FileTimeToSystemTime(FILETIME *lpFileTime,LPSYSTEMTIME lpSystemTime)

{
  FILETIME FVar1;
  BOOL BVar2;
  tm *ptVar3;
  undefined1 local_50 [8];
  tm timeBuf;
  
  timeBuf.tm_zone = (char *)0x0;
  FVar1 = *lpFileTime;
  if ((ulong)FVar1 < 0x19db1ded53e8001) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
    BVar2 = 0;
  }
  else {
    if ((long)((long)FVar1 + 0xfe624e212ac18000U) < 0) {
      timeBuf.tm_zone = (char *)~((0x19db1ded53e7fffU - (long)FVar1) / 10000000);
    }
    else {
      timeBuf.tm_zone = (char *)(((long)FVar1 + 0xfe624e212ac18000U) / 10000000);
    }
    ptVar3 = gmtime_r((time_t *)&timeBuf.tm_zone,(tm *)local_50);
    lpSystemTime->wDay = (WORD)ptVar3->tm_mday;
    lpSystemTime->wMonth = (short)ptVar3->tm_mon + 1;
    lpSystemTime->wYear = (short)ptVar3->tm_year + 0x76c;
    lpSystemTime->wSecond = (WORD)ptVar3->tm_sec;
    lpSystemTime->wMinute = (WORD)ptVar3->tm_min;
    lpSystemTime->wHour = (WORD)ptVar3->tm_hour;
    BVar2 = 1;
  }
  return BVar2;
}

Assistant:

BOOL PALAPI FileTimeToSystemTime( CONST FILETIME * lpFileTime, 
                                  LPSYSTEMTIME lpSystemTime )
{
    UINT64 FileTime = 0;
    time_t UnixFileTime = 0;
    struct tm * UnixSystemTime = 0;

    /* Combine the file time. */
    FileTime = lpFileTime->dwHighDateTime;
    FileTime <<= 32;
    FileTime |= (UINT)lpFileTime->dwLowDateTime;
    const UINT64 since1601 = SECS_BETWEEN_1601_AND_1970_EPOCHS * SECS_TO_100NS;

    if (FileTime > since1601 && since1601 >= 0) 
    {
        FileTime -= since1601;
#if HAVE_GMTIME_R
        struct tm timeBuf;
#endif  /* HAVE_GMTIME_R */
        /* Convert file time to unix time. */
        if (((INT64)FileTime) < 0)
        {
            UnixFileTime =  -1 - ( ( -FileTime - 1 ) / 10000000 );            
        }
        else
        {
            UnixFileTime = FileTime / 10000000;
        }

        /* Convert unix file time to Unix System time. */
#if HAVE_GMTIME_R
        UnixSystemTime = gmtime_r( &UnixFileTime, &timeBuf );
#else   /* HAVE_GMTIME_R */
        UnixSystemTime = gmtime( &UnixFileTime );
#endif  /* HAVE_GMTIME_R */

        /* Convert unix system time to Windows system time. */
        lpSystemTime->wDay      = UnixSystemTime->tm_mday;
    
        /* Unix time counts January as a 0, under Windows it is 1*/
        lpSystemTime->wMonth    = UnixSystemTime->tm_mon + 1;
        /* Unix time returns the year - 1900, Windows returns the current year*/
        lpSystemTime->wYear     = UnixSystemTime->tm_year + 1900;
        
        lpSystemTime->wSecond   = UnixSystemTime->tm_sec;
        lpSystemTime->wMinute   = UnixSystemTime->tm_min;
        lpSystemTime->wHour     = UnixSystemTime->tm_hour;
        return TRUE;
    }
    else
    {
        ERROR( "The file time is to large.\n" );
        SetLastError(ERROR_INVALID_PARAMETER);
        return FALSE;
    }
}